

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cc
# Opt level: O2

void brotli::EmitDistance
               (size_t distance,uint8_t *depth,uint16_t *bits,uint32_t *histo,size_t *storage_ix,
               uint8_t *storage)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = distance + 3;
  uVar2 = 0x1f;
  if ((uint)uVar1 != 0) {
    for (; (uint)uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  uVar5 = 0x1e - (uVar2 ^ 0x1f);
  uVar3 = (ulong)((uVar1 >> ((ulong)uVar5 & 0x3f) & 1) != 0);
  uVar4 = ((uVar2 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar3;
  WriteBits((ulong)depth[uVar4 + 0x50],(ulong)bits[uVar4 + 0x50],storage_ix,storage);
  WriteBits((ulong)uVar5,uVar1 - (uVar3 + 2 << ((byte)uVar5 & 0x3f)),storage_ix,storage);
  histo[uVar4 + 0x50] = histo[uVar4 + 0x50] + 1;
  return;
}

Assistant:

inline void EmitDistance(size_t distance,
                         const uint8_t depth[128],
                         const uint16_t bits[128],
                         uint32_t histo[128],
                         size_t* storage_ix, uint8_t* storage) {
  distance += 3;
  const uint32_t nbits = Log2FloorNonZero(distance) - 1u;
  const size_t prefix = (distance >> nbits) & 1;
  const size_t offset = (2 + prefix) << nbits;
  const size_t distcode = 2 * (nbits - 1) + prefix + 80;
  WriteBits(depth[distcode], bits[distcode], storage_ix, storage);
  WriteBits(nbits, distance - offset, storage_ix, storage);
  ++histo[distcode];
}